

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

uint SOIL_direct_load_DDS(char *filename,uint reuse_texture_ID,int flags,int loading_as_cubemap)

{
  FILE *__stream;
  size_t __size;
  void *__ptr;
  char *in_RDI;
  uint tex_ID;
  size_t bytes_read;
  size_t buffer_length;
  uchar *buffer;
  FILE *f;
  int in_stack_000000c8;
  int in_stack_000000cc;
  uint in_stack_000000d0;
  int in_stack_000000d4;
  uchar *in_stack_000000d8;
  uint local_4;
  
  if (in_RDI == (char *)0x0) {
    result_string_pointer = "NULL filename";
    local_4 = 0;
  }
  else {
    __stream = fopen(in_RDI,"rb");
    if (__stream == (FILE *)0x0) {
      result_string_pointer = "Can not find DDS file";
      local_4 = 0;
    }
    else {
      fseek(__stream,0,2);
      __size = ftell(__stream);
      fseek(__stream,0,0);
      __ptr = malloc(__size);
      if (__ptr == (void *)0x0) {
        result_string_pointer = "malloc failed";
        fclose(__stream);
        local_4 = 0;
      }
      else {
        fread(__ptr,1,__size,__stream);
        fclose(__stream);
        local_4 = SOIL_direct_load_DDS_from_memory
                            (in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,in_stack_000000cc
                             ,in_stack_000000c8);
        SOIL_free_image_data((uchar *)0x114caa);
      }
    }
  }
  return local_4;
}

Assistant:

unsigned int SOIL_direct_load_DDS(
		const char *filename,
		unsigned int reuse_texture_ID,
		int flags,
		int loading_as_cubemap )
{
	FILE *f;
	unsigned char *buffer;
	size_t buffer_length, bytes_read;
	unsigned int tex_ID = 0;
	/*	error checks	*/
	if( NULL == filename )
	{
		result_string_pointer = "NULL filename";
		return 0;
	}
	f = fopen( filename, "rb" );
	if( NULL == f )
	{
		/*	the file doesn't seem to exist (or be open-able)	*/
		result_string_pointer = "Can not find DDS file";
		return 0;
	}
	fseek( f, 0, SEEK_END );
	buffer_length = ftell( f );
	fseek( f, 0, SEEK_SET );
	buffer = (unsigned char *) malloc( buffer_length );
	if( NULL == buffer )
	{
		result_string_pointer = "malloc failed";
		fclose( f );
		return 0;
	}
	bytes_read = fread( (void*)buffer, 1, buffer_length, f );
	fclose( f );
	if( bytes_read < buffer_length )
	{
		/*	huh?	*/
		buffer_length = bytes_read;
	}
	/*	now try to do the loading	*/
	tex_ID = SOIL_direct_load_DDS_from_memory(
		(const unsigned char *const)buffer, buffer_length,
		reuse_texture_ID, flags, loading_as_cubemap );
	SOIL_free_image_data( buffer );
	return tex_ID;
}